

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *
pbrt::
returnArray<pbrt::Spectrum,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>,pbrt::ParameterDictionary::extractSpectrumArray(pbrt::ParsedParameter_const&,pbrt::SpectrumType,pstd::pmr::polymorphic_allocator<std::byte>)const::__3>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *values,ParsedParameter *param,int nPerItem,anon_class_248_2_f6f1f733 *convert)

{
  bool bVar1;
  size_t sVar2;
  Spectrum *this;
  const_reference pvVar3;
  int in_ECX;
  anon_class_248_2_f6f1f733 *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *in_RDI;
  FileLoc *in_R8;
  size_t i;
  size_t n;
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *v;
  vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  Spectrum *__n;
  int *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  FileLoc *in_stack_ffffffffffffffd0;
  Spectrum *pSVar4;
  FileLoc *loc;
  undefined4 in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  loc = in_R8;
  bVar1 = pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x7e8a1e);
  if (bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  }
  sVar2 = pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  if (sVar2 % (ulong)(long)in_ECX == 0) {
    (in_RDX->param).lookedUp = true;
    sVar2 = pstd::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    this = (Spectrum *)(sVar2 / (ulong)(long)in_ECX);
    pSVar4 = this;
    std::allocator<pbrt::Spectrum>::allocator((allocator<pbrt::Spectrum> *)0x7e8ac2);
    std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::vector
              (this_00,(size_type)in_RDI,(allocator_type *)in_R8);
    std::allocator<pbrt::Spectrum>::~allocator((allocator<pbrt::Spectrum> *)0x7e8ae2);
    for (__n = (Spectrum *)0x0; __n < pSVar4;
        __n = (Spectrum *)
              ((long)&(__n->
                      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                      ).bits + 1)) {
      pvVar3 = pstd::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RSI,(long)in_ECX * (long)__n);
      ParameterDictionary::extractSpectrumArray::anon_class_248_2_f6f1f733::operator()
                (in_RDX,(string *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),loc);
      std::vector<pbrt::Spectrum,_std::allocator<pbrt::Spectrum>_>::operator[]
                (in_RDI,(size_type)__n);
      Spectrum::operator=(this,(Spectrum *)pvVar3);
    }
    return this_00;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            (in_stack_ffffffffffffffd0,
             (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}